

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RandSequenceStatementSyntax *syntax)

{
  size_type sVar1;
  Compilation *compilation;
  pointer ppPVar2;
  ProductionSyntax *syntax_00;
  SourceLocation defaultLoc;
  StatementBlockSymbol *pSVar3;
  RandSeqProductionSymbol *symbol;
  long lVar4;
  Scope *this;
  string_view sVar5;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffb0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  defaultLoc = parsing::Token::location(&syntax->randsequence);
  getLabel(&local_48,&syntax->super_StatementSyntax,defaultLoc);
  pSVar3 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)local_48.first._M_len,
                       (string_view)local_48._8_16_,(SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffb0);
  sVar1 = (syntax->productions).
          super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    compilation = scope->compilation;
    ppPVar2 = (syntax->productions).
              super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.data_;
    this = &pSVar3->super_Scope;
    lVar4 = 0;
    do {
      syntax_00 = *(ProductionSyntax **)((long)ppPVar2 + lVar4);
      sVar5 = parsing::Token::valueText(&syntax_00->name);
      if (sVar5._M_len != 0) {
        symbol = RandSeqProductionSymbol::fromSyntax(compilation,syntax_00);
        Scope::addMember(this,&symbol->super_Symbol);
      }
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return pSVar3;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RandSequenceStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.randsequence.location());
    auto result = createBlock(scope, syntax, name, loc, StatementBlockKind::Sequential,
                              VariableLifetime::Automatic);

    auto& comp = scope.getCompilation();
    for (auto prod : syntax.productions) {
        if (prod->name.valueText().empty())
            continue;

        auto& symbol = RandSeqProductionSymbol::fromSyntax(comp, *prod);
        result->addMember(symbol);
    }

    return *result;
}